

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,std::shared_ptr<ThreadState>>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<ThreadState>>>>
::
emplace_at<std::piecewise_construct_t_const&,std::tuple<unsigned_int&>,std::tuple<std::shared_ptr<ThreadState>&&>>
          (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,std::shared_ptr<ThreadState>>,phmap::Hash<unsigned_long>,phmap::EqualTo<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<ThreadState>>>>
           *this,size_t i,piecewise_construct_t *args,tuple<unsigned_int_&> *args_1,
          tuple<std::shared_ptr<ThreadState>_&&> *args_2)

{
  key_arg<unsigned_long> *key;
  shared_ptr<ThreadState> *psVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined1 auVar3 [16];
  ulong uVar4;
  iterator iVar5;
  
  key = (key_arg<unsigned_long> *)(*(long *)(this + 8) + i * 0x18);
  psVar1 = (args_2->super__Tuple_impl<0UL,_std::shared_ptr<ThreadState>_&&>).
           super__Head_base<0UL,_std::shared_ptr<ThreadState>_&&,_false>._M_head_impl;
  uVar4 = CONCAT44(0,*(args_1->super__Tuple_impl<0UL,_unsigned_int_&>).
                      super__Head_base<0UL,_unsigned_int_&,_false>._M_head_impl);
  *key = uVar4;
  key[1] = (key_arg<unsigned_long>)
           (psVar1->super___shared_ptr<ThreadState,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  key[2] = 0;
  p_Var2 = (psVar1->super___shared_ptr<ThreadState,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (psVar1->super___shared_ptr<ThreadState,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  key[2] = (key_arg<unsigned_long>)p_Var2;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar4;
  (psVar1->super___shared_ptr<ThreadState,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0
  ;
  iVar5 = raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
          ::find<unsigned_long>
                    ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
                      *)this,key,
                     SUB168(auVar3 * ZEXT816(0xde5fb9d2630458e9),8) +
                     SUB168(auVar3 * ZEXT816(0xde5fb9d2630458e9),0));
  if (iVar5.ctrl_ == (ctrl_t *)(i + *(long *)this)) {
    return;
  }
  __assert_fail("PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) == iterator_at(i) && \"constructed value does not match the lookup key\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x802,
                "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned long, std::shared_ptr<ThreadState>>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, std::shared_ptr<ThreadState>>>>::emplace_at(size_t, Args &&...) [Policy = phmap::container_internal::FlatHashMapPolicy<unsigned long, std::shared_ptr<ThreadState>>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, std::shared_ptr<ThreadState>>>, Args = <const std::piecewise_construct_t &, std::tuple<unsigned int &>, std::tuple<std::shared_ptr<ThreadState> &&>>]"
               );
}

Assistant:

void emplace_at(size_t i, Args&&... args) {
        PolicyTraits::construct(&alloc_ref(), slots_ + i,
                                std::forward<Args>(args)...);

        assert(PolicyTraits::apply(FindElement{*this}, *iterator_at(i)) ==
               iterator_at(i) &&
               "constructed value does not match the lookup key");
    }